

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O2

void __thiscall Raytracer::Image::Image(Image *this,int _width,int _height)

{
  undefined1 auVar1 [16];
  RGB **ppRVar2;
  RGB *pRVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  this->width = _width;
  this->height = _height;
  uVar8 = 0;
  uVar7 = (ulong)(uint)_height << 3;
  if (_height < 0) {
    uVar7 = 0xffffffffffffffff;
  }
  uVar6 = (ulong)(uint)_height;
  if (_height < 1) {
    uVar6 = uVar8;
  }
  ppRVar2 = (RGB **)operator_new__(uVar7);
  this->datas = ppRVar2;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)_width;
  uVar7 = SUB168(auVar1 * ZEXT816(0xc),0);
  if (SUB168(auVar1 * ZEXT816(0xc),8) != 0) {
    uVar7 = 0xffffffffffffffff;
  }
  uVar5 = (ulong)(uint)_width;
  if (_width < 1) {
    uVar5 = uVar8;
  }
  for (; uVar8 != uVar6; uVar8 = uVar8 + 1) {
    pRVar3 = (RGB *)operator_new__(uVar7);
    ppRVar2[uVar8] = pRVar3;
    ppRVar2 = this->datas;
    for (lVar4 = 0; uVar5 * 0xc - lVar4 != 0; lVar4 = lVar4 + 0xc) {
      pRVar3 = ppRVar2[uVar8];
      *(undefined8 *)((long)&pRVar3->r + lVar4) = 0x437f0000;
      *(undefined4 *)((long)&pRVar3->b + lVar4) = 0;
    }
  }
  return;
}

Assistant:

Raytracer::Image::Image( int _width, int _height) {
    this->width = _width;
    this->height = _height;
    this->datas = new Raytracer::RGB * [_height];
    for(int y = 0;y<height;y++){
        datas[y] = new Raytracer::RGB[width];
        for(int x = 0;x<width;x++) {
            datas[y][x].r = 255.f;
            datas[y][x].g = 0.f;
            datas[y][x].b = 0.f;
        }
    }
}